

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yescrypt-simd.c
# Opt level: O1

void smix1(uint8_t *B,size_t r,uint32_t N,yescrypt_flags_t flags,salsa20_blk_t *V,uint32_t NROM,
          salsa20_blk_t *VROM,salsa20_blk_t *XY,pwxform_ctx_t *ctx)

{
  long lVar1;
  uint32_t uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  salsa20_blk_t *psVar6;
  uint uVar7;
  salsa20_blk_t *psVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  
  lVar1 = r * 2;
  if (r != 0) {
    lVar10 = 0;
    psVar6 = V;
    do {
      lVar9 = 0;
      psVar8 = psVar6;
      do {
        psVar8->w[0] = *(uint32_t *)(B + ((ulong)((uint)lVar9 & 0x3c) | lVar10 << 6));
        lVar9 = lVar9 + 0x14;
        psVar8 = (salsa20_blk_t *)(psVar8->w + 1);
      } while (lVar9 != 0x140);
      lVar10 = lVar10 + 1;
      psVar6 = psVar6 + 1;
    } while (lVar10 != lVar1 + (ulong)(lVar1 == 0));
  }
  if (VROM == (salsa20_blk_t *)0x0) {
    if ((flags & YESCRYPT_RW) == 0) {
      uVar3 = 1;
      psVar6 = V;
      if (1 < N - 1) {
        uVar3 = 1;
        do {
          blockmix_salsa8(psVar6,V + uVar3 * lVar1,r);
          psVar6 = V + (ulong)((int)uVar3 + 1) * lVar1;
          blockmix_salsa8(V + uVar3 * lVar1,psVar6,r);
          uVar14 = (int)uVar3 + 2;
          uVar3 = (ulong)uVar14;
        } while (uVar14 < N - 1);
        uVar3 = (ulong)uVar14;
      }
      blockmix_salsa8(psVar6,V + uVar3 * lVar1,r);
      blockmix_salsa8(V + uVar3 * lVar1,XY,r);
    }
    else {
      blockmix(V,V + r * 2,r,ctx);
      psVar6 = V + r * 4;
      blockmix(V + r * 2,psVar6,r,ctx);
      uVar14 = psVar6[r * 2 + -1].w[0];
      uVar5 = 1;
      if (2 < N) {
        uVar3 = 2;
        do {
          uVar5 = (uint)uVar3;
          uVar4 = ~uVar5 + N;
          if (uVar5 < N >> 1) {
            uVar4 = uVar5;
          }
          if (1 < uVar4) {
            uVar13 = 1;
            do {
              iVar12 = (int)uVar13;
              uVar2 = blockmix_xor(psVar6,V + (ulong)(((uVar14 & uVar5 - 1) + iVar12) - 1) * lVar1,
                                   V + uVar3 * lVar1 + uVar13 * lVar1,r,0,ctx);
              psVar6 = V + uVar3 * lVar1 + (ulong)(iVar12 + 1) * lVar1;
              uVar14 = blockmix_xor(V + uVar3 * lVar1 + uVar13 * lVar1,
                                    V + (ulong)((uVar2 & uVar5 - 1) + iVar12) * lVar1,psVar6,r,0,ctx
                                   );
              uVar13 = (ulong)(iVar12 + 2U);
            } while (iVar12 + 2U < uVar4);
          }
          uVar3 = (ulong)(uVar5 * 2);
        } while (uVar5 * 2 < N);
        uVar5 = uVar5 & 0x7ffffffe;
      }
      uVar2 = blockmix_xor(psVar6,V + (ulong)(((N - uVar5) + (uVar14 & uVar5 - 1)) - 2) * lVar1,
                           V + (ulong)(N - 1) * lVar1,r,0,ctx);
      blockmix_xor(V + (ulong)(N - 1) * lVar1,
                   V + (ulong)(((N - 1) - uVar5) + (uVar5 - 1 & uVar2)) * lVar1,XY,r,0,ctx);
    }
  }
  else {
    psVar6 = V + r * 2;
    blockmix(V,psVar6,r,ctx);
    psVar8 = V + r * 4;
    uVar5 = NROM - 1;
    uVar14 = blockmix_xor(psVar6,VROM + (ulong)(psVar6[r * 2 + -1].w[0] & uVar5) * lVar1,psVar8,r,1,
                          ctx);
    if (N < 3) {
      uVar4 = 1;
    }
    else {
      uVar3 = 2;
      do {
        uVar4 = (uint)uVar3;
        uVar7 = ~uVar4 + N;
        if (uVar4 < N >> 1) {
          uVar7 = uVar4;
        }
        if (1 < uVar7) {
          uVar11 = 1;
          do {
            uVar2 = blockmix_xor(psVar8,V + (ulong)(((uVar14 & uVar4 - 1) + uVar11) - 1) * lVar1,
                                 V + uVar3 * lVar1 + (ulong)uVar11 * lVar1,r,0,ctx);
            psVar8 = V + uVar3 * lVar1 + (ulong)(uVar11 + 1) * lVar1;
            uVar14 = blockmix_xor(V + uVar3 * lVar1 + (ulong)uVar11 * lVar1,
                                  VROM + (ulong)(uVar2 & uVar5) * lVar1,psVar8,r,1,ctx);
            uVar11 = uVar11 + 2;
          } while (uVar11 < uVar7);
        }
        uVar3 = (ulong)(uVar4 * 2);
      } while (uVar4 * 2 < N);
      uVar4 = uVar4 & 0x7ffffffe;
    }
    uVar2 = blockmix_xor(psVar8,V + (ulong)(((uVar4 - 1 & uVar14) + (N - uVar4)) - 2) * lVar1,
                         V + (ulong)(N - 1) * lVar1,r,0,ctx);
    blockmix_xor(V + (ulong)(N - 1) * lVar1,VROM + (ulong)(uVar5 & uVar2) * lVar1,XY,r,1,ctx);
  }
  if (r != 0) {
    lVar10 = 0;
    do {
      lVar9 = 0;
      psVar6 = XY;
      do {
        *(uint32_t *)(B + ((ulong)((uint)lVar9 & 0x3c) | lVar10 << 6)) = psVar6->w[0];
        lVar9 = lVar9 + 0x14;
        psVar6 = (salsa20_blk_t *)(psVar6->w + 1);
      } while (lVar9 != 0x140);
      lVar10 = lVar10 + 1;
      XY = XY + 1;
    } while (lVar10 != lVar1 + (ulong)(lVar1 == 0));
  }
  return;
}

Assistant:

static void
smix1(uint8_t * B, size_t r, uint32_t N, yescrypt_flags_t flags,
    salsa20_blk_t * V, uint32_t NROM, const salsa20_blk_t * VROM,
    salsa20_blk_t * XY, pwxform_ctx_t * ctx)
{
	size_t s = 2 * r;
	salsa20_blk_t * X = V, * Y;
	uint32_t i, j;
	size_t k;

	/* 1: X <-- B */
	/* 3: V_i <-- X */
	for (k = 0; k < 2 * r; k++) {
		for (i = 0; i < 16; i++) {
			X[k].w[i] = le32dec(&B[(k * 16 + (i * 5 % 16)) * 4]);
		}
	}

	if (VROM) {
		uint32_t n;
		salsa20_blk_t * V_n;
		const salsa20_blk_t * V_j;

		/* 4: X <-- H(X) */
		/* 3: V_i <-- X */
		Y = &V[s];
		blockmix(X, Y, r, ctx);

		X = &V[2 * s];
		/* j <-- Integerify(X) mod NROM */
		j = integerify(Y, r) & (NROM - 1);
		V_j = &VROM[j * s];

		/* X <-- H(X \xor VROM_j) */
		j = blockmix_xor(Y, V_j, X, r, 1, ctx);

		for (n = 2; n < N; n <<= 1) {
			uint32_t m = (n < N / 2) ? n : (N - 1 - n);

			V_n = &V[n * s];

			/* 2: for i = 0 to N - 1 do */
			for (i = 1; i < m; i += 2) {
				/* j <-- Wrap(Integerify(X), i) */
				j &= n - 1;
				j += i - 1;
				V_j = &V[j * s];

				/* X <-- X \xor V_j */
				/* 4: X <-- H(X) */
				/* 3: V_i <-- X */
				Y = &V_n[i * s];

				/* j <-- Integerify(X) mod NROM */
				j = blockmix_xor(X, V_j, Y, r, 0, ctx) & (NROM - 1);
				V_j = &VROM[j * s];

				/* X <-- H(X \xor VROM_j) */
				X = &V_n[(i + 1) * s];
				j = blockmix_xor(Y, V_j, X, r, 1, ctx);
			}
		}

		n >>= 1;

		/* j <-- Wrap(Integerify(X), i) */
		j &= n - 1;
		j += N - 2 - n;
		V_j = &V[j * s];

		/* X <-- X \xor V_j */
		/* 4: X <-- H(X) */
		/* 3: V_i <-- X */
		Y = &V[(N - 1) * s];

		/* j <-- Integerify(X) mod NROM */
		j = blockmix_xor(X, V_j, Y, r, 0, ctx) & (NROM - 1);
		V_j = &VROM[j * s];

		/* X <-- X \xor V_j */
		/* 4: X <-- H(X) */
		X = XY;
		blockmix_xor(Y, V_j, X, r, 1, ctx);
	} else if (flags & YESCRYPT_RW) {
		uint32_t n;
		salsa20_blk_t * V_n, * V_j;

		/* 4: X <-- H(X) */
		/* 3: V_i <-- X */
		Y = &V[s];
		blockmix(X, Y, r, ctx);

		/* 4: X <-- H(X) */
		/* 3: V_i <-- X */
		X = &V[2 * s];
		blockmix(Y, X, r, ctx);
		j = integerify(X, r);

		for (n = 2; n < N; n <<= 1) {
			uint32_t m = (n < N / 2) ? n : (N - 1 - n);

			V_n = &V[n * s];

			/* 2: for i = 0 to N - 1 do */
			for (i = 1; i < m; i += 2) {
				Y = &V_n[i * s];

				/* j <-- Wrap(Integerify(X), i) */
				j &= n - 1;
				j += i - 1;
				V_j = &V[j * s];

				/* X <-- X \xor V_j */
				/* 4: X <-- H(X) */
				/* 3: V_i <-- X */
				j = blockmix_xor(X, V_j, Y, r, 0, ctx);

				/* j <-- Wrap(Integerify(X), i) */
				j &= n - 1;
				j += i;
				V_j = &V[j * s];

				/* X <-- X \xor V_j */
				/* 4: X <-- H(X) */
				/* 3: V_i <-- X */
				X = &V_n[(i + 1) * s];
				j = blockmix_xor(Y, V_j, X, r, 0, ctx);
			}
		}

		n >>= 1;

		/* j <-- Wrap(Integerify(X), i) */
		j &= n - 1;
		j += N - 2 - n;
		V_j = &V[j * s];

		/* X <-- X \xor V_j */
		/* 4: X <-- H(X) */
		/* 3: V_i <-- X */
		Y = &V[(N - 1) * s];
		j = blockmix_xor(X, V_j, Y, r, 0, ctx);

		/* j <-- Wrap(Integerify(X), i) */
		j &= n - 1;
		j += N - 1 - n;
		V_j = &V[j * s];

		/* X <-- X \xor V_j */
		/* 4: X <-- H(X) */
		X = XY;
		blockmix_xor(Y, V_j, X, r, 0, ctx);
	} else {
		/* 2: for i = 0 to N - 1 do */
		for (i = 1; i < N - 1; i += 2) {
			/* 4: X <-- H(X) */
			/* 3: V_i <-- X */
			Y = &V[i * s];
			blockmix_salsa8(X, Y, r);

			/* 4: X <-- H(X) */
			/* 3: V_i <-- X */
			X = &V[(i + 1) * s];
			blockmix_salsa8(Y, X, r);
		}

		/* 4: X <-- H(X) */
		/* 3: V_i <-- X */
		Y = &V[i * s];
		blockmix_salsa8(X, Y, r);

		/* 4: X <-- H(X) */
		X = XY;
		blockmix_salsa8(Y, X, r);
	}

	/* B' <-- X */
	for (k = 0; k < 2 * r; k++) {
		for (i = 0; i < 16; i++) {
			le32enc(&B[(k * 16 + (i * 5 % 16)) * 4], X[k].w[i]);
		}
	}
}